

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O3

void __thiscall lscpp::stdio_transporter::reserve(stdio_transporter *this,size_t size)

{
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  
  uVar1 = this->size_;
  uVar4 = uVar1;
  if (uVar1 < size) {
    do {
      uVar4 = uVar4 * 2;
    } while (uVar4 < size);
    this->size_ = uVar4;
    if (uVar1 < size) {
      pcVar3 = (char *)operator_new__(uVar4);
      pcVar2 = (this->data_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
      (this->data_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl = pcVar3;
      if (pcVar2 != (char *)0x0) {
        operator_delete__(pcVar2);
        return;
      }
    }
  }
  return;
}

Assistant:

void stdio_transporter::reserve(std::size_t size) {
  bool reallocate = false;
  while (size > size_) {
    reallocate = true;
    size_ *= 2;
  }
  if (reallocate)
    data_.reset(new char[size_]);
}